

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

Def * __thiscall hdc::Parser::parse_def(Parser *this)

{
  bool bVar1;
  Def *this_00;
  Type *pTVar2;
  CompoundStatement *statements;
  Token name;
  undefined1 local_60 [48];
  
  this_00 = (Def *)operator_new(0xb8);
  Def::Def(this_00);
  expect(this,TK_DEF);
  expect(this,TK_ID);
  Token::Token((Token *)local_60,(this->matched)._M_current);
  Def::setName(this_00,(Token *)local_60);
  std::__cxx11::string::~string((string *)(local_60 + 0x10));
  expect(this,TK_COLON);
  pTVar2 = parse_type(this);
  Def::setReturnType(this_00,pTVar2);
  expect(this,TK_NEWLINE);
  expect(this,TK_BEGIN);
  while( true ) {
    bVar1 = hasParameters(this);
    if (!bVar1) break;
    match(this,TK_AT);
    name.lexem._M_dataplus._M_p = (pointer)&name.lexem.field_2;
    name.lexem._M_string_length = 0;
    name.lexem.field_2._M_local_buf[0] = '\0';
    expect(this,TK_ID);
    Token::operator=(&name,(this->matched)._M_current);
    expect(this,TK_COLON);
    pTVar2 = parse_type(this);
    expect(this,TK_NEWLINE);
    Def::addParameter(this_00,&name,pTVar2);
    std::__cxx11::string::~string((string *)&name.lexem);
  }
  statements = parse_statements(this);
  Def::setStatements(this_00,statements);
  expect(this,TK_END);
  return this_00;
}

Assistant:

Def* Parser::parse_def() {
    Def* def = new Def();

    expect(TK_DEF);
    expect(TK_ID);

    def->setName(*matched);

    expect(TK_COLON);
    def->setReturnType(parse_type());

    expect(TK_NEWLINE);
    expect(TK_BEGIN);

    while (hasParameters()) {
    //while (match(TK_AT)) {
        match(TK_AT);
        Token name;
        Type* ptype;

        expect(TK_ID);
        name = *matched;

        expect(TK_COLON);
        ptype = parse_type();
        expect(TK_NEWLINE);

        def->addParameter(name, ptype);
    }

    def->setStatements(parse_statements());
    expect(TK_END);

    return def;
}